

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O3

void __thiscall QDnsLookupPrivate::QDnsLookupPrivate(QDnsLookupPrivate *this)

{
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QDnsLookupPrivate_002cff98;
  (this->name).super_QPropertyData<QString>.val.d.d = (Data *)0x0;
  (this->name).super_QPropertyData<QString>.val.d.ptr = (char16_t *)0x0;
  (this->name).super_QPropertyData<QString>.val.d.size = 0;
  QHostAddress::QHostAddress((QHostAddress *)&this->nameserver);
  (this->type).super_QPropertyData<QDnsLookup::Type>.val = A;
  (this->port).super_QPropertyData<unsigned_short>.val = 0;
  (this->protocol).super_QPropertyData<QDnsLookup::Protocol>.val = Standard;
  (this->reply).error = NoError;
  (this->reply).authenticData = false;
  (this->reply).sslConfiguration.super__Optional_base<QSslConfiguration,_false,_false>._M_payload.
  super__Optional_payload<QSslConfiguration,_true,_false,_false>.
  super__Optional_payload_base<QSslConfiguration>._M_engaged = false;
  memset(&(this->reply).errorString,0,0xd8);
  this->runnable = (QDnsLookupRunnable *)0x0;
  this->isFinished = false;
  (this->sslConfiguration).super__Optional_base<QSslConfiguration,_false,_false>._M_payload.
  super__Optional_payload<QSslConfiguration,_true,_false,_false>.
  super__Optional_payload_base<QSslConfiguration>._M_engaged = false;
  return;
}

Assistant:

QDnsLookupPrivate()
        : type(QDnsLookup::A)
        , port(0)
        , protocol(QDnsLookup::Standard)
    { }